

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_MAC_Poly1305.c
# Opt level: O0

void Hacl_MAC_Poly1305_free(Hacl_MAC_Poly1305_state_t *state)

{
  uint64_t *__ptr;
  uint8_t *__ptr_00;
  uint64_t *block_state;
  uint8_t *buf;
  uint8_t *k_;
  Hacl_MAC_Poly1305_state_t scrut;
  Hacl_MAC_Poly1305_state_t *state_local;
  
  __ptr = state->block_state;
  __ptr_00 = state->buf;
  free(state->p_key);
  free(__ptr);
  free(__ptr_00);
  free(state);
  return;
}

Assistant:

void Hacl_MAC_Poly1305_free(Hacl_MAC_Poly1305_state_t *state)
{
  Hacl_MAC_Poly1305_state_t scrut = *state;
  uint8_t *k_ = scrut.p_key;
  uint8_t *buf = scrut.buf;
  uint64_t *block_state = scrut.block_state;
  KRML_HOST_FREE(k_);
  KRML_HOST_FREE(block_state);
  KRML_HOST_FREE(buf);
  KRML_HOST_FREE(state);
}